

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O3

void __thiscall
script_standard_tests::script_standard_GetScriptFor_::test_method
          (script_standard_GetScriptFor_ *this)

{
  uint uVar1;
  void *pvVar2;
  ScriptHash *pSVar3;
  bool bVar4;
  long lVar5;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar6;
  CScript *pCVar7;
  CSHA256 *this_00;
  uint uVar8;
  size_type sVar9;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  CKey *this_01;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  Span<unsigned_char> output;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  uint160 result;
  uint256 scriptHash;
  CPubKey pubkeys [3];
  CKey keys [3];
  check_type cVar13;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  uchar local_2a8 [16];
  undefined1 local_298 [28];
  size_type local_27c;
  undefined1 local_278 [20];
  uchar auStack_264 [52];
  __index_type local_230;
  char *local_228 [3];
  undefined4 uStack_210;
  uint uStack_20c;
  char *local_208 [3];
  uint local_1ec;
  undefined1 local_1e8 [28];
  uint uStack_1cc;
  undefined1 local_1c8 [28];
  uint uStack_1ac;
  CPubKey local_1a8;
  CPubKey local_167;
  CPubKey local_126;
  undefined1 local_e5 [21];
  undefined8 auStack_d0 [5];
  undefined **local_a8 [9];
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = 8;
  do {
    local_e5[lVar5 + 5] = 0;
    *(undefined8 *)(local_e5 + lVar5 + 0xd) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x38);
  local_1a8.vch[0] = 0xff;
  local_167.vch[0] = 0xff;
  local_126.vch[0] = 0xff;
  this_01 = (CKey *)(local_e5 + 0xd);
  lVar5 = 0;
  do {
    CKey::MakeNewKey(this_01,true);
    CKey::GetPubKey((CPubKey *)local_a8,this_01);
    memcpy(local_1a8.vch + lVar5,(CPubKey *)local_a8,0x41);
    lVar5 = lVar5 + 0x41;
    this_01 = this_01 + 1;
  } while (lVar5 != 0xc3);
  local_1c8._16_8_ = 0;
  stack0xfffffffffffffe50 = 0;
  local_1c8._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
  local_1c8._8_8_ = 0;
  local_1e8._16_4_ = 0;
  local_1e8._20_4_ = 0;
  local_1e8._24_4_ = 0;
  uStack_1cc = 0;
  local_1e8._0_8_ = (char *)0x0;
  local_1e8._8_4_ = 0;
  local_1e8._12_4_ = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,0);
  sVar9 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    sVar9 = uStack_1ac;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,sVar9);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8._0_8_;
  uVar8 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8;
    uVar8 = uStack_1ac;
  }
  local_a8[0]._0_1_ = (vector<unsigned_char,std::allocator<unsigned_char>>)0x76;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar8),(uchar *)local_a8);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8._0_8_;
  uVar8 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8;
    uVar8 = uStack_1ac;
  }
  local_a8[0] = (undefined **)CONCAT71(local_a8[0]._1_7_,0xa9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar8),(uchar *)local_a8);
  CPubKey::GetID((CKeyID *)local_278,&local_1a8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a8,local_278,auStack_264,
             (allocator_type *)local_208);
  ppVar6 = &CScript::operator<<((CScript *)local_1c8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8)->
            super_CScriptBase;
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_208[0]._0_1_ = (allocator_type)0x88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)local_208);
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_208[0] = (char *)CONCAT71(local_208[0]._1_7_,0xac);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)local_208);
  if (local_a8[0] != (undefined **)0x0) {
    operator_delete(local_a8[0],CONCAT44(local_a8[2]._4_4_,local_a8[2]._0_4_) - (long)local_a8[0]);
  }
  PKHash::PKHash((PKHash *)local_208,&local_1a8);
  local_a8[2]._0_4_ = local_208[2]._0_4_;
  local_a8[0] = (undefined **)local_208[0];
  local_a8[1]._0_4_ = SUB84(local_208[1],0);
  local_a8[1]._4_4_ = (undefined4)((ulong)local_208[1] >> 0x20);
  uStack_60 = CONCAT71(uStack_60._1_7_,'\x02');
  GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_a8);
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._0_8_ = local_278._0_8_;
  uStack_1cc._0_1_ = auStack_264[8];
  uStack_1cc._1_1_ = auStack_264[9];
  uStack_1cc._2_1_ = auStack_264[10];
  uStack_1cc._3_1_ = auStack_264[0xb];
  auStack_264[8] = '\0';
  auStack_264[9] = '\0';
  auStack_264[10] = '\0';
  auStack_264[0xb] = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_a8);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x126;
  file.m_begin = (iterator)&local_2c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2d8,msg);
  bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_278[0] = bVar4;
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  local_208[0] = "result == expected";
  local_208[1] = (char *)((long)"result == expected" + 0x12);
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2e0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_a8[3] = (undefined **)local_208;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_278,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_2e8,0x126);
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_208,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,0);
  sVar9 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    sVar9 = uStack_1ac;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,sVar9);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8._0_8_;
  uVar8 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8;
    uVar8 = uStack_1ac;
  }
  local_a8[0] = (undefined **)CONCAT71(local_a8[0]._1_7_,0xa9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar8),(uchar *)local_a8);
  CScriptID::CScriptID((CScriptID *)local_278,(CScript *)local_208);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a8,local_278,auStack_264,
             (allocator_type *)local_228);
  ppVar6 = &CScript::operator<<((CScript *)local_1c8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8)->
            super_CScriptBase;
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_228[0] = (char *)CONCAT71(local_228[0]._1_7_,0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)local_228);
  if (local_a8[0] != (undefined **)0x0) {
    operator_delete(local_a8[0],CONCAT44(local_a8[2]._4_4_,local_a8[2]._0_4_) - (long)local_a8[0]);
  }
  ScriptHash::ScriptHash((ScriptHash *)local_228,(CScript *)local_208);
  local_a8[2]._0_4_ = local_228[2]._0_4_;
  local_a8[0] = (undefined **)local_228[0];
  local_a8[1]._0_4_ = local_228[1]._0_4_;
  uStack_60 = CONCAT71(uStack_60._1_7_,3);
  GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_a8);
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._16_4_ = local_278._16_4_;
  local_1e8[0x14] = auStack_264[0];
  local_1e8[0x15] = auStack_264[1];
  local_1e8[0x16] = auStack_264[2];
  local_1e8[0x17] = auStack_264[3];
  local_1e8._0_8_ = local_278._0_8_;
  local_1e8._8_4_ = local_278._8_4_;
  local_1e8._12_4_ = local_278._12_4_;
  uStack_1cc._0_1_ = auStack_264[8];
  uStack_1cc._1_1_ = auStack_264[9];
  uStack_1cc._2_1_ = auStack_264[10];
  uStack_1cc._3_1_ = auStack_264[0xb];
  auStack_264[8] = '\0';
  auStack_264[9] = '\0';
  auStack_264[10] = '\0';
  auStack_264[0xb] = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_a8);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12d;
  file_00.m_begin = (iterator)&local_2f8;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_308,
             msg_00);
  bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_278[0] = bVar4;
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  local_228[0] = "result == expected";
  local_228[1]._0_4_ = 0xecdc16;
  local_228[1]._4_1_ = '\0';
  local_228[1]._5_1_ = '\0';
  local_228[1]._6_1_ = '\0';
  local_228[1]._7_1_ = '\0';
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_310 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_a8[3] = (undefined **)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_278,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_318,0x12d);
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,0);
  sVar9 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    sVar9 = uStack_1ac;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,sVar9);
  uStack_60 = uStack_60 & 0xffffffffffffff00;
  local_a8[0] = (undefined **)0x0;
  local_a8[1]._0_4_ = 0;
  local_a8[1]._4_1_ = '\0';
  local_a8[1]._5_1_ = '\0';
  local_a8[1]._6_1_ = '\0';
  local_a8[1]._7_1_ = '\0';
  local_a8[2]._0_1_ = '\0';
  local_a8[2]._1_1_ = '\0';
  local_a8[2]._2_1_ = '\0';
  local_a8[2]._3_1_ = '\0';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_a8[3]._0_1_ = '\0';
  local_a8[3]._1_1_ = '\0';
  local_a8[3]._2_1_ = '\0';
  local_a8[3]._3_1_ = '\0';
  local_a8[3]._4_1_ = '\0';
  local_a8[3]._5_1_ = '\0';
  local_a8[3]._6_1_ = '\0';
  local_a8[3]._7_1_ = '\0';
  GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_a8);
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._16_4_ = local_278._16_4_;
  local_1e8[0x14] = auStack_264[0];
  local_1e8[0x15] = auStack_264[1];
  local_1e8[0x16] = auStack_264[2];
  local_1e8[0x17] = auStack_264[3];
  local_1e8._0_8_ = local_278._0_8_;
  local_1e8._8_4_ = local_278._8_4_;
  local_1e8._12_4_ = local_278._12_4_;
  uStack_1cc._0_1_ = auStack_264[8];
  uStack_1cc._1_1_ = auStack_264[9];
  uStack_1cc._2_1_ = auStack_264[10];
  uStack_1cc._3_1_ = auStack_264[0xb];
  auStack_264[8] = '\0';
  auStack_264[9] = '\0';
  auStack_264[10] = '\0';
  auStack_264[0xb] = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_a8);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x132;
  file_01.m_begin = (iterator)&local_328;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_338,
             msg_01);
  bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  local_228[0] = "result == expected";
  local_228[1]._0_4_ = 0xecdc16;
  local_228[1]._4_1_ = '\0';
  local_228[1]._5_1_ = '\0';
  local_228[1]._6_1_ = '\0';
  local_228[1]._7_1_ = '\0';
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_340 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_278[0] = bVar4;
  local_a8[3] = (undefined **)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_278,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_348,0x132);
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,0);
  sVar9 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    sVar9 = uStack_1ac;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,sVar9);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,&local_1a8);
  ppVar6 = &CScript::operator<<((CScript *)local_1c8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8)->
            super_CScriptBase;
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_278[0] = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),local_278);
  if (local_a8[0] != (undefined **)0x0) {
    operator_delete(local_a8[0],CONCAT44(local_a8[2]._4_4_,local_a8[2]._0_4_) - (long)local_a8[0]);
  }
  GetScriptForRawPubKey((CScript *)local_a8,&local_1a8);
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._16_4_ = local_a8[2]._0_4_;
  local_1e8._20_4_ = local_a8[2]._4_4_;
  local_1e8._0_8_ = local_a8[0];
  local_1e8._8_4_ = local_a8[1]._0_4_;
  local_1e8._12_4_ = local_a8[1]._4_4_;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x138;
  file_02.m_begin = (iterator)&local_358;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  unique0x100029aa = (ScriptHash *)local_a8[3];
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_368,
             msg_02);
  bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_278[0] = bVar4;
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  local_228[0] = "result == expected";
  local_228[1]._0_4_ = 0xecdc16;
  local_228[1]._4_1_ = '\0';
  local_228[1]._5_1_ = '\0';
  local_228[1]._6_1_ = '\0';
  local_228[1]._7_1_ = '\0';
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_370 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_a8[3] = (undefined **)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_278,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_378,0x138);
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,0);
  sVar9 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    sVar9 = uStack_1ac;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,sVar9);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8._0_8_;
  uVar8 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8;
    uVar8 = uStack_1ac;
  }
  local_a8[0] = (undefined **)CONCAT71(local_a8[0]._1_7_,0x52);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar8),(uchar *)local_a8);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,&local_1a8);
  pCVar7 = CScript::operator<<((CScript *)local_1c8,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,&local_167);
  pCVar7 = CScript::operator<<(pCVar7,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_278);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_228,&local_126);
  ppVar6 = &CScript::operator<<(pCVar7,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_228)->super_CScriptBase;
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_298[0] = (allocator_type)0x53;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),local_298);
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_298[0] = (allocator_type)0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),local_298);
  if ((pointer)local_228[0] != (pointer)0x0) {
    operator_delete(local_228[0],
                    CONCAT44(local_228[2]._4_4_,local_228[2]._0_4_) - (long)local_228[0]);
  }
  if ((char *)local_278._0_8_ != (char *)0x0) {
    operator_delete((void *)local_278._0_8_,
                    CONCAT44(auStack_264._0_4_,local_278._16_4_) - local_278._0_8_);
  }
  if (local_a8[0] != (undefined **)0x0) {
    operator_delete(local_a8[0],CONCAT44(local_a8[2]._4_4_,local_a8[2]._0_4_) - (long)local_a8[0]);
  }
  std::vector<CPubKey,std::allocator<CPubKey>>::vector<CPubKey*,void>
            ((vector<CPubKey,std::allocator<CPubKey>> *)local_278,&local_1a8,(CPubKey *)local_e5,
             (allocator_type *)local_228);
  GetScriptForMultisig((CScript *)local_a8,2,(vector<CPubKey,_std::allocator<CPubKey>_> *)local_278)
  ;
  pSVar3 = (ScriptHash *)local_a8[3];
  if ((ScriptHash *)0x1cffffffff < stack0xfffffffffffffe30) {
    free((void *)local_1e8._0_8_);
    pSVar3 = (ScriptHash *)local_a8[3];
  }
  local_a8[3]._0_4_ = SUB84(pSVar3,0);
  local_1e8._16_4_ = local_a8[2]._0_4_;
  local_1e8._20_4_ = local_a8[2]._4_4_;
  local_1e8._0_8_ = local_a8[0];
  local_1e8._8_4_ = local_a8[1]._0_4_;
  local_1e8._12_4_ = local_a8[1]._4_4_;
  local_a8[3]._4_1_ = '\0';
  local_a8[3]._5_1_ = '\0';
  local_a8[3]._6_1_ = '\0';
  local_a8[3]._7_1_ = '\0';
  unique0x100029c2 = pSVar3;
  if ((char *)local_278._0_8_ != (char *)0x0) {
    operator_delete((void *)local_278._0_8_,
                    CONCAT44(auStack_264._0_4_,local_278._16_4_) - local_278._0_8_);
  }
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x142;
  file_03.m_begin = (iterator)&local_388;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_398,
             msg_03);
  bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_278[0] = bVar4;
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  local_228[0] = "result == expected";
  local_228[1]._0_4_ = 0xecdc16;
  local_228[1]._4_1_ = '\0';
  local_228[1]._5_1_ = '\0';
  local_228[1]._6_1_ = '\0';
  local_228[1]._7_1_ = '\0';
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3a0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_a8[3] = (undefined **)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_278,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_3a8,0x142);
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,0);
  sVar9 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    sVar9 = uStack_1ac;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,sVar9);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8._0_8_;
  uVar8 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8;
    uVar8 = uStack_1ac;
  }
  local_a8[0] = (undefined **)((ulong)local_a8[0] & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar8),(uchar *)local_a8);
  CPubKey::GetID((CKeyID *)local_278,&local_1a8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a8,local_278,auStack_264,
             (allocator_type *)local_228);
  CScript::operator<<((CScript *)local_1c8,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  if (local_a8[0] != (undefined **)0x0) {
    operator_delete(local_a8[0],CONCAT44(local_a8[2]._4_4_,local_a8[2]._0_4_) - (long)local_a8[0]);
  }
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298,&local_1a8);
  local_2b8 = (undefined1  [8])0x0;
  uStack_2b0._0_1_ = '\0';
  uStack_2b0._1_1_ = '\0';
  uStack_2b0._2_1_ = '\0';
  uStack_2b0._3_1_ = '\0';
  uStack_2b0._4_1_ = '\0';
  uStack_2b0._5_1_ = '\0';
  uStack_2b0._6_1_ = '\0';
  uStack_2b0._7_1_ = '\0';
  local_2a8[0] = '\0';
  local_2a8[1] = '\0';
  local_2a8[2] = '\0';
  local_2a8[3] = '\0';
  local_58._0_1_ = '\0';
  local_58._1_1_ = '\0';
  local_58._2_1_ = '\0';
  local_58._3_1_ = '\0';
  local_58._4_1_ = '\0';
  local_58._5_1_ = '\0';
  local_58._6_1_ = '\0';
  local_58._7_1_ = '\0';
  uStack_50._0_1_ = '\0';
  uStack_50._1_1_ = '\0';
  uStack_50._2_1_ = '\0';
  uStack_50._3_1_ = '\0';
  uStack_50._4_1_ = '\0';
  uStack_50._5_1_ = '\0';
  uStack_50._6_1_ = '\0';
  uStack_50._7_1_ = '\0';
  local_a8[8] = (undefined **)0x0;
  uStack_60._0_1_ = '\0';
  uStack_60._1_1_ = '\0';
  uStack_60._2_1_ = '\0';
  uStack_60._3_1_ = '\0';
  uStack_60._4_1_ = '\0';
  uStack_60._5_1_ = '\0';
  uStack_60._6_1_ = '\0';
  uStack_60._7_1_ = '\0';
  local_a8[6] = (undefined **)0x0;
  local_a8[7] = (undefined **)0x0;
  local_a8[4] = (undefined **)0x0;
  local_a8[5] = (undefined **)0x0;
  local_a8[2]._0_1_ = '\0';
  local_a8[2]._1_1_ = '\0';
  local_a8[2]._2_1_ = '\0';
  local_a8[2]._3_1_ = '\0';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_a8[3]._0_1_ = '\0';
  local_a8[3]._1_1_ = '\0';
  local_a8[3]._2_1_ = '\0';
  local_a8[3]._3_1_ = '\0';
  local_a8[3]._4_1_ = '\0';
  local_a8[3]._5_1_ = '\0';
  local_a8[3]._6_1_ = '\0';
  local_a8[3]._7_1_ = '\0';
  local_a8[0] = (undefined **)0x0;
  local_a8[1]._0_4_ = 0;
  local_a8[1]._4_1_ = '\0';
  local_a8[1]._5_1_ = '\0';
  local_a8[1]._6_1_ = '\0';
  local_a8[1]._7_1_ = '\0';
  local_48 = 0;
  CSHA256::CSHA256((CSHA256 *)local_a8);
  CSHA256::Write((CSHA256 *)local_a8,(uchar *)CONCAT71(local_298._1_7_,local_298[0]),
                 CONCAT44(local_298._12_4_,local_298._8_4_) -
                 (long)CONCAT71(local_298._1_7_,local_298[0]));
  output.m_size = 0x14;
  output.m_data = local_2b8;
  CHash160::Finalize((CHash160 *)local_a8,output);
  local_278._0_8_ = local_2b8;
  local_278._8_4_ = SUB84(uStack_2b0,0);
  local_278._12_4_ = SUB84(uStack_2b0,4);
  local_278[0x10] = local_2a8[0];
  local_278[0x11] = local_2a8[1];
  local_278[0x12] = local_2a8[2];
  local_278[0x13] = local_2a8[3];
  local_230 = '\x05';
  GetScriptForDestination((CScript *)local_228,(CTxDestination *)local_278);
  if ((ScriptHash *)0x1cffffffff < stack0xfffffffffffffe30) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._0_8_ = local_228[0];
  local_1e8._8_4_ = local_228[1]._0_4_;
  local_1e8._12_4_ = local_228[1]._4_4_;
  uStack_1cc = uStack_20c;
  uStack_20c = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_278);
  pvVar2 = (void *)CONCAT71(local_298._1_7_,local_298[0]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT44(local_298._20_4_,local_298._16_4_) - (long)pvVar2);
  }
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x148;
  file_04.m_begin = (iterator)&local_3b8;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3c8,
             msg_04);
  bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_278[0] = bVar4;
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  local_228[0] = "result == expected";
  local_228[1]._0_4_ = 0xecdc16;
  local_228[1]._4_1_ = '\0';
  local_228[1]._5_1_ = '\0';
  local_228[1]._6_1_ = '\0';
  local_228[1]._7_1_ = '\0';
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3d0 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_a8[3] = (undefined **)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_278,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_3d8,0x148);
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 0x10));
  CPubKey::GetID((CKeyID *)local_228,&local_1a8);
  local_a8[2]._0_4_ = local_228[2]._0_4_;
  local_a8[0] = (undefined **)local_228[0];
  local_a8[1]._0_4_ = local_228[1]._0_4_;
  local_a8[1]._4_4_ = local_228[1]._4_4_;
  uStack_60 = CONCAT71(uStack_60._1_7_,'\x05');
  GetScriptForDestination((CScript *)local_278,(CTxDestination *)local_a8);
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._16_4_ = local_278._16_4_;
  local_1e8[0x14] = auStack_264[0];
  local_1e8[0x15] = auStack_264[1];
  local_1e8[0x16] = auStack_264[2];
  local_1e8[0x17] = auStack_264[3];
  local_1e8._0_8_ = local_278._0_8_;
  local_1e8._8_4_ = local_278._8_4_;
  local_1e8._12_4_ = local_278._12_4_;
  uStack_1cc._0_1_ = auStack_264[8];
  uStack_1cc._1_1_ = auStack_264[9];
  uStack_1cc._2_1_ = auStack_264[10];
  uStack_1cc._3_1_ = auStack_264[0xb];
  auStack_264[8] = '\0';
  auStack_264[9] = '\0';
  auStack_264[10] = '\0';
  auStack_264[0xb] = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_a8);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x14a;
  file_05.m_begin = (iterator)&local_3e8;
  msg_05.m_end = pvVar12;
  msg_05.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3f8,
             msg_05);
  bVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_278[0] = bVar4;
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  local_228[0] = "result == expected";
  local_228[1]._0_4_ = 0xecdc16;
  local_228[1]._4_1_ = '\0';
  local_228[1]._5_1_ = '\0';
  local_228[1]._6_1_ = '\0';
  local_228[1]._7_1_ = '\0';
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_400 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_a8[3] = (undefined **)local_228;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_278,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_408,0x14a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_278 + 0x10));
  local_278[0x10] = '\0';
  local_278[0x11] = '\0';
  local_278[0x12] = '\0';
  local_278[0x13] = '\0';
  auStack_264[0] = '\0';
  auStack_264[1] = '\0';
  auStack_264[2] = '\0';
  auStack_264[3] = '\0';
  auStack_264[4] = '\0';
  auStack_264[5] = '\0';
  auStack_264[6] = '\0';
  auStack_264[7] = '\0';
  auStack_264[8] = '\0';
  auStack_264[9] = '\0';
  auStack_264[10] = '\0';
  auStack_264[0xb] = '\0';
  local_278._0_8_ = (CScript *)0x0;
  local_278._8_4_ = 0;
  local_278[0xc] = '\0';
  local_278[0xd] = '\0';
  local_278[0xe] = '\0';
  local_278[0xf] = '\0';
  local_a8[0] = (undefined **)CONCAT71(local_a8[0]._1_7_,0x51);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_278,(iterator)local_278,
             (uchar *)local_a8);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,&local_1a8);
  ppVar6 = &CScript::operator<<((CScript *)local_278,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8)->
            super_CScriptBase;
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_228[0]._0_1_ = (allocator_type)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)local_228);
  uVar8 = ppVar6->_size;
  uVar1 = uVar8 - 0x1d;
  if (uVar8 < 0x1d) {
    uVar1 = uVar8;
  }
  ppVar10 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar6->_union).indirect_contents.indirect;
  if (uVar8 < 0x1d) {
    ppVar10 = ppVar6;
  }
  local_228[0] = (char *)CONCAT71(local_228[0]._1_7_,0xae);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar6,(uchar *)((long)&ppVar10->_union + (long)(int)uVar1),(uchar *)local_228);
  if (local_a8[0] != (undefined **)0x0) {
    operator_delete(local_a8[0],CONCAT44(local_a8[2]._4_4_,local_a8[2]._0_4_) - (long)local_a8[0]);
  }
  local_228[2]._0_1_ = '\0';
  local_228[2]._1_1_ = '\0';
  local_228[2]._2_1_ = '\0';
  local_228[2]._3_1_ = '\0';
  local_228[2]._4_4_ = 0;
  uStack_210 = 0;
  uStack_20c = 0;
  local_228[0] = (char *)0x0;
  local_228[1]._0_4_ = 0;
  local_228[1]._4_1_ = '\0';
  local_228[1]._5_1_ = '\0';
  local_228[1]._6_1_ = '\0';
  local_228[1]._7_1_ = '\0';
  CSHA256::CSHA256((CSHA256 *)local_a8);
  uVar8 = auStack_264._8_4_ - 0x1d;
  pCVar7 = (CScript *)local_278._0_8_;
  if ((uint)auStack_264._8_4_ < 0x1d) {
    uVar8 = auStack_264._8_4_;
    pCVar7 = (CScript *)local_278;
  }
  this_00 = CSHA256::Write((CSHA256 *)local_a8,(uchar *)pCVar7,(ulong)uVar8);
  CSHA256::Finalize(this_00,(uchar *)local_228);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,0);
  sVar9 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    sVar9 = uStack_1ac;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,sVar9);
  ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8._0_8_;
  uVar8 = uStack_1ac - 0x1d;
  if (uStack_1ac < 0x1d) {
    ppVar6 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8;
    uVar8 = uStack_1ac;
  }
  local_a8[0] = (undefined **)((ulong)local_a8[0] & 0xffffffffffffff00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8,
             (uchar *)((long)&ppVar6->_union + (long)(int)uVar8),(uchar *)local_a8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a8,(uchar *)local_228,
             (uchar *)local_208,(allocator_type *)local_298);
  CScript::operator<<((CScript *)local_1c8,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  if (local_a8[0] != (undefined **)0x0) {
    operator_delete(local_a8[0],CONCAT44(local_a8[2]._4_4_,local_a8[2]._0_4_) - (long)local_a8[0]);
  }
  WitnessV0ScriptHash::WitnessV0ScriptHash((WitnessV0ScriptHash *)local_2b8,(CScript *)local_278);
  local_a8[2]._0_1_ = local_2a8[0];
  local_a8[2]._1_1_ = local_2a8[1];
  local_a8[2]._2_1_ = local_2a8[2];
  local_a8[2]._3_1_ = local_2a8[3];
  local_a8[3]._0_4_ = (undefined4)local_2a8._8_8_;
  local_a8[3]._4_4_ = SUB84(local_2a8._8_8_,4);
  local_a8[0] = (undefined **)local_2b8;
  local_a8[1]._0_4_ = SUB84(uStack_2b0,0);
  local_a8[1]._4_4_ = SUB84(uStack_2b0,4);
  uStack_60 = CONCAT71(uStack_60._1_7_,'\x04');
  GetScriptForDestination((CScript *)local_298,(CTxDestination *)local_a8);
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  local_1e8._0_8_ = CONCAT71(local_298._1_7_,local_298[0]);
  uStack_1cc = local_27c;
  local_27c = 0;
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)local_a8);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x157;
  file_06.m_begin = (iterator)&local_418;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_428,
             msg_06);
  local_298[0] = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1e8,
                            (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_1c8);
  local_298._8_4_ = 0;
  local_298._12_4_ = 0;
  local_298._16_4_ = 0;
  local_298._20_4_ = 0;
  local_2b8 = (undefined1  [8])0xecdc04;
  uStack_2b0 = "";
  local_a8[1]._0_4_ = local_a8[1]._0_4_ & 0xffffff00;
  local_a8[0] = &PTR__lazy_ostream_013ae1c8;
  local_a8[2]._0_1_ = '8';
  local_a8[2]._1_1_ = '!';
  local_a8[2]._2_1_ = '<';
  local_a8[2]._3_1_ = '\x01';
  local_a8[2]._4_1_ = '\0';
  local_a8[2]._5_1_ = '\0';
  local_a8[2]._6_1_ = '\0';
  local_a8[2]._7_1_ = '\0';
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_430 = "";
  local_a8[3] = (undefined **)local_2b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_298,(lazy_ostream *)local_a8,1,0,WARN,_cVar13,
             (size_t)&local_438,0x157);
  boost::detail::shared_count::~shared_count((shared_count *)(local_298 + 0x10));
  if (0x1c < (uint)auStack_264._8_4_) {
    free((void *)local_278._0_8_);
  }
  if (0x1c < local_1ec) {
    free(local_208[0]);
  }
  if (0x1c < uStack_1cc) {
    free((void *)local_1e8._0_8_);
  }
  if (0x1c < uStack_1ac) {
    free((void *)local_1c8._0_8_);
  }
  lVar5 = 0x28;
  do {
    if (*(array<unsigned_char,_32UL> **)(local_e5 + lVar5 + 0xd) !=
        (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)(local_e5 + lVar5 + 0xd),
                 *(array<unsigned_char,_32UL> **)(local_e5 + lVar5 + 0xd));
    }
    *(undefined8 *)(local_e5 + lVar5 + 0xd) = 0;
    lVar5 = lVar5 + -0x10;
  } while (lVar5 != -8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_GetScriptFor_)
{
    CKey keys[3];
    CPubKey pubkeys[3];
    for (int i = 0; i < 3; i++) {
        keys[i].MakeNewKey(true);
        pubkeys[i] = keys[i].GetPubKey();
    }

    CScript expected, result;

    // PKHash
    expected.clear();
    expected << OP_DUP << OP_HASH160 << ToByteVector(pubkeys[0].GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    result = GetScriptForDestination(PKHash(pubkeys[0]));
    BOOST_CHECK(result == expected);

    // CScriptID
    CScript redeemScript(result);
    expected.clear();
    expected << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    result = GetScriptForDestination(ScriptHash(redeemScript));
    BOOST_CHECK(result == expected);

    // CNoDestination
    expected.clear();
    result = GetScriptForDestination(CNoDestination());
    BOOST_CHECK(result == expected);

    // GetScriptForRawPubKey
    expected.clear();
    expected << ToByteVector(pubkeys[0]) << OP_CHECKSIG;
    result = GetScriptForRawPubKey(pubkeys[0]);
    BOOST_CHECK(result == expected);

    // GetScriptForMultisig
    expected.clear();
    expected << OP_2 <<
        ToByteVector(pubkeys[0]) <<
        ToByteVector(pubkeys[1]) <<
        ToByteVector(pubkeys[2]) <<
        OP_3 << OP_CHECKMULTISIG;
    result = GetScriptForMultisig(2, std::vector<CPubKey>(pubkeys, pubkeys + 3));
    BOOST_CHECK(result == expected);

    // WitnessV0KeyHash
    expected.clear();
    expected << OP_0 << ToByteVector(pubkeys[0].GetID());
    result = GetScriptForDestination(WitnessV0KeyHash(Hash160(ToByteVector(pubkeys[0]))));
    BOOST_CHECK(result == expected);
    result = GetScriptForDestination(WitnessV0KeyHash(pubkeys[0].GetID()));
    BOOST_CHECK(result == expected);

    // WitnessV0ScriptHash (multisig)
    CScript witnessScript;
    witnessScript << OP_1 << ToByteVector(pubkeys[0]) << OP_1 << OP_CHECKMULTISIG;

    uint256 scriptHash;
    CSHA256().Write(witnessScript.data(), witnessScript.size())
        .Finalize(scriptHash.begin());

    expected.clear();
    expected << OP_0 << ToByteVector(scriptHash);
    result = GetScriptForDestination(WitnessV0ScriptHash(witnessScript));
    BOOST_CHECK(result == expected);
}